

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_24_3_1824b316 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c;
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  pointer puVar6;
  bool bVar7;
  int iVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  long lVar10;
  ulong uVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  int *piVar14;
  long lVar15;
  pointer pdVar16;
  int __tmp;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  _DistanceType __len;
  int *piVar21;
  int *piVar22;
  ulong uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  T tmp;
  T pivot;
  int local_84;
  
  lVar10 = (long)end._M_current - (long)begin._M_current;
  uVar19 = lVar10 >> 2;
  if (0x17 < (long)uVar19) {
    c._M_current = end._M_current + -1;
    local_84 = bad_allowed;
LAB_00283441:
    uVar11 = uVar19 >> 1;
    _Var9._M_current = begin._M_current + uVar11;
    if (uVar19 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                (_Var9,begin,c,comp);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                (begin,_Var9,c,comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar11 - 1)),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (end._M_current + -2),comp);
      piVar21 = begin._M_current + uVar11;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 2),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar21 + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (end._M_current + -3),comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar11 - 1)),_Var9,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar21 + 1),
                 comp);
      iVar3 = *begin._M_current;
      *begin._M_current = *piVar21;
      *piVar21 = iVar3;
    }
    iVar3 = *begin._M_current;
    if ((leftmost & 1U) == 0) {
      iVar17 = begin._M_current[-1];
      pdVar16 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar1 = (comp.this)->feastol;
      uVar24 = SUB84(dVar1,0);
      uVar25 = (undefined4)((ulong)dVar1 >> 0x20);
      if ((pdVar16[iVar17] <= dVar1) || (dVar1 < pdVar16[iVar3])) {
        if ((dVar1 < pdVar16[iVar17]) || (pdVar16[iVar3] <= dVar1)) {
          puVar6 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = (comp.this)->inds[iVar17];
          uVar5 = (comp.this)->inds[iVar3];
          lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar5 * 0x38);
          lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0'].
                                   _M_t.
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar4 * 0x38);
          if ((lVar20 < lVar15) ||
             ((lVar20 <= lVar15 &&
              (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
              lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
              (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
              ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20) <
              (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
              ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20))))) goto LAB_00283631;
        }
        dVar2 = pdVar16[iVar3];
        lVar10 = 0;
        do {
          iVar17 = *(c._M_current + lVar10);
          if ((dVar2 <= dVar1) || (dVar1 < pdVar16[iVar17])) {
            if ((dVar2 <= dVar1) && (dVar1 < pdVar16[iVar17])) goto LAB_00283f39;
            puVar6 = ((comp.this)->complementation).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar4 = (comp.this)->inds[iVar3];
            uVar5 = (comp.this)->inds[iVar17];
            lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0'].
                                     _M_t.
                                     super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                     .
                                     super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                               + 0x30 + (long)(int)uVar5 * 0x38);
            lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0'].
                                     _M_t.
                                     super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                     .
                                     super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                               + 0x30 + (long)(int)uVar4 * 0x38);
            if ((lVar15 <= lVar20) &&
               ((lVar15 < lVar20 ||
                (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
                lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
                (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
                ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20) <=
                (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
                ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20))))) goto LAB_00283f39;
          }
          lVar10 = lVar10 + -4;
        } while( true );
      }
    }
    else {
      pdVar16 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar24 = SUB84((comp.this)->feastol,0);
      uVar25 = (undefined4)((ulong)(comp.this)->feastol >> 0x20);
    }
LAB_00283631:
    lVar20 = 0;
    _Var9._M_current = begin._M_current;
    do {
      piVar21 = _Var9._M_current + 1;
      iVar17 = *piVar21;
      dVar1 = pdVar16[iVar17];
      if ((dVar1 < (double)CONCAT44(uVar25,uVar24) || dVar1 == (double)CONCAT44(uVar25,uVar24)) ||
         ((double)CONCAT44(uVar25,uVar24) < pdVar16[iVar3])) {
        if ((dVar1 <= (double)CONCAT44(uVar25,uVar24)) &&
           ((double)CONCAT44(uVar25,uVar24) <= pdVar16[iVar3] &&
            pdVar16[iVar3] != (double)CONCAT44(uVar25,uVar24))) goto LAB_0028374c;
        puVar6 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (comp.this)->inds[iVar17];
        uVar5 = (comp.this)->inds[iVar3];
        lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                 .
                                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           + 0x30 + (long)(int)uVar5 * 0x38);
        lVar18 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0']._M_t.
                                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                 .
                                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           + 0x30 + (long)(int)uVar4 * 0x38);
        if ((lVar18 <= lVar15) &&
           ((lVar18 < lVar15 ||
            (lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
            lVar18 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
            (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar18 >> 0x20 ^
            ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar15) <=
            (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar18 >> 0x20 ^
            ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar15))))) goto LAB_0028374c;
      }
      lVar20 = lVar20 + -4;
      _Var9._M_current = piVar21;
    } while( true );
  }
  if (!leftmost) goto LAB_002843ef;
LAB_00283158:
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    pdVar16 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar1 = (comp.this)->feastol;
    lVar10 = 0;
    piVar21 = begin._M_current + 1;
    piVar14 = begin._M_current;
    do {
      piVar22 = piVar21;
      iVar3 = *piVar14;
      iVar17 = piVar14[1];
      dVar2 = pdVar16[iVar17];
      if ((dVar2 <= dVar1) || (dVar1 < pdVar16[iVar3])) {
        if ((dVar1 < dVar2) || (pdVar16[iVar3] <= dVar1)) {
          puVar6 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = (comp.this)->inds[iVar17];
          uVar5 = (comp.this)->inds[iVar3];
          lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar5 * 0x38);
          lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0'].
                                   _M_t.
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar4 * 0x38);
          if ((lVar20 < lVar15) ||
             ((lVar20 <= lVar15 &&
              (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
              lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
              (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
              ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20) <
              (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
              ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20))))) goto LAB_00283239;
        }
      }
      else {
LAB_00283239:
        piVar21 = piVar22 + -1;
        piVar14[1] = iVar3;
        piVar14 = begin._M_current;
        lVar20 = lVar10;
        if (piVar21 != begin._M_current) {
          do {
            iVar3 = *(begin._M_current + lVar20 + -4);
            if ((dVar2 <= dVar1) || (dVar1 < pdVar16[iVar3])) {
              piVar14 = piVar21;
              if ((dVar2 <= dVar1) && (dVar1 < pdVar16[iVar3])) break;
              puVar6 = ((comp.this)->complementation).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar4 = (comp.this)->inds[iVar17];
              uVar5 = (comp.this)->inds[iVar3];
              lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0'].
                                       _M_t.
                                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                       .
                                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                                 + 0x30 + (long)(int)uVar5 * 0x38);
              lVar18 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0']
                                       ._M_t.
                                       super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                       .
                                       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                                 + 0x30 + (long)(int)uVar4 * 0x38);
              if (lVar18 <= lVar15) {
                if (lVar18 < lVar15) {
                  piVar14 = lVar20 + begin._M_current;
                  break;
                }
                lVar18 = (ulong)(uint)*comp.r + 0x8a183895eeac1536;
                lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3;
                if ((((ulong)uVar4 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
                    ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar18) <=
                    (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
                    ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar18)) break;
              }
            }
            piVar21 = piVar21 + -1;
            *(begin._M_current + lVar20) = iVar3;
            lVar20 = lVar20 + -4;
            piVar14 = begin._M_current;
          } while (lVar20 != 0);
        }
        *piVar14 = iVar17;
      }
      lVar10 = lVar10 + 4;
      piVar21 = piVar22 + 1;
      piVar14 = piVar22;
    } while (piVar22 + 1 != end._M_current);
  }
  return;
LAB_00283f39:
  piVar21 = c._M_current + lVar10;
  _Var9._M_current = begin._M_current;
  iVar8 = iVar3;
  if (lVar10 == 0) {
joined_r0x00284081:
    if (_Var9._M_current < piVar21) {
      while( true ) {
        _Var9._M_current = _Var9._M_current + 1;
        iVar8 = *_Var9._M_current;
        if ((dVar1 < dVar2) && (pdVar16[iVar8] <= dVar1)) goto LAB_002841a3;
        if ((dVar2 <= dVar1) && (dVar1 < pdVar16[iVar8])) break;
        puVar6 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (comp.this)->inds[iVar3];
        uVar5 = (comp.this)->inds[iVar8];
        lVar10 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar8] != '\0']._M_t.
                                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                 .
                                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           + 0x30 + (long)(int)uVar5 * 0x38);
        lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                 .
                                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           + 0x30 + (long)(int)uVar4 * 0x38);
        if (lVar10 < lVar20) goto LAB_002841a3;
        if (lVar20 < lVar10) break;
        if ((piVar21 <= _Var9._M_current) ||
           (lVar10 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
           lVar20 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
           (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar20 >> 0x20 ^
           ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar10) <
           (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar20 >> 0x20 ^
           ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar10))) goto LAB_002841a3;
      }
      goto joined_r0x00284081;
    }
  }
  else {
    while( true ) {
      _Var9._M_current = _Var9._M_current + 1;
      iVar8 = *_Var9._M_current;
      if ((dVar1 < dVar2) && (pdVar16[iVar8] <= dVar1)) break;
      if ((dVar1 < dVar2) || (pdVar16[iVar8] <= dVar1)) {
        puVar6 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (comp.this)->inds[iVar3];
        uVar5 = (comp.this)->inds[iVar8];
        lVar10 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar8] != '\0']._M_t.
                                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                 .
                                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           + 0x30 + (long)(int)uVar5 * 0x38);
        lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                 .
                                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           + 0x30 + (long)(int)uVar4 * 0x38);
        if ((lVar10 < lVar20) ||
           ((lVar10 <= lVar20 &&
            (lVar10 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
            lVar20 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
            (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar20 >> 0x20 ^
            ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar10) <
            (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar20 >> 0x20 ^
            ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar10))))) break;
      }
    }
  }
LAB_002841a3:
  if (_Var9._M_current < piVar21) {
LAB_002841b4:
    *_Var9._M_current = iVar17;
    *piVar21 = iVar8;
LAB_002841bf:
    do {
      piVar21 = piVar21 + -1;
      iVar17 = *piVar21;
      if (dVar1 < dVar2) {
        if (pdVar16[iVar17] <= dVar1) goto LAB_002841bf;
      }
      if ((dVar2 <= dVar1) && (dVar1 < pdVar16[iVar17])) goto LAB_002842ab;
      puVar6 = ((comp.this)->complementation).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (comp.this)->inds[iVar3];
      uVar5 = (comp.this)->inds[iVar17];
      lVar10 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0']._M_t.
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         + 0x30 + (long)(int)uVar5 * 0x38);
      lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         + 0x30 + (long)(int)uVar4 * 0x38);
      if ((lVar20 <= lVar10) &&
         ((lVar20 < lVar10 ||
          (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
          lVar10 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
          (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
          ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20) <=
          (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
          ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20))))) goto LAB_002842ab;
    } while( true );
  }
LAB_002843a9:
  *begin._M_current = iVar17;
  *piVar21 = iVar3;
  begin._M_current = piVar21 + 1;
  lVar10 = (long)end._M_current - (long)begin._M_current;
  uVar19 = lVar10 >> 2;
  goto LAB_002843ce;
LAB_002842ab:
  _Var9._M_current = _Var9._M_current + 1;
  iVar8 = *_Var9._M_current;
  if ((dVar1 < dVar2) && (pdVar16[iVar8] <= dVar1)) goto LAB_00284398;
  if ((dVar1 < dVar2) || (pdVar16[iVar8] <= dVar1)) {
    puVar6 = ((comp.this)->complementation).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (comp.this)->inds[iVar3];
    uVar5 = (comp.this)->inds[iVar8];
    lVar10 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar8] != '\0']._M_t.
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                       + 0x30 + (long)(int)uVar5 * 0x38);
    lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                       + 0x30 + (long)(int)uVar4 * 0x38);
    if ((lVar10 < lVar20) ||
       ((lVar10 <= lVar20 &&
        (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
        lVar10 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
        (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
        ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20) <
        (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
        ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20))))) goto LAB_00284398;
  }
  goto LAB_002842ab;
LAB_00284398:
  if (piVar21 <= _Var9._M_current) goto LAB_002843a9;
  goto LAB_002841b4;
LAB_0028374c:
  _Var13._M_current = c._M_current;
  if (lVar20 == 0) {
    _Var12._M_current = c._M_current;
    _Var13._M_current = end._M_current;
    if (piVar21 < end._M_current) {
      while( true ) {
        iVar8 = *_Var12._M_current;
        dVar1 = pdVar16[iVar8];
        _Var13._M_current = _Var12._M_current;
        if (((double)CONCAT44(uVar25,uVar24) <= dVar1 && dVar1 != (double)CONCAT44(uVar25,uVar24))
           && (pdVar16[iVar3] <= (double)CONCAT44(uVar25,uVar24))) break;
        if (((double)CONCAT44(uVar25,uVar24) < dVar1) ||
           (pdVar16[iVar3] < (double)CONCAT44(uVar25,uVar24) ||
            pdVar16[iVar3] == (double)CONCAT44(uVar25,uVar24))) {
          puVar6 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = (comp.this)->inds[iVar8];
          uVar5 = (comp.this)->inds[iVar3];
          lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar5 * 0x38);
          lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar8] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar4 * 0x38);
          if (lVar20 < lVar15) break;
          if (lVar15 < lVar20) goto LAB_002838f2;
          if ((_Var12._M_current <= piVar21) ||
             (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
             lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
             (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
             ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20) <
             (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
             ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20))) break;
        }
        else {
LAB_002838f2:
          if (_Var12._M_current <= piVar21) break;
        }
        _Var12._M_current = _Var12._M_current + -1;
      }
    }
  }
  else {
    while( true ) {
      iVar8 = *_Var13._M_current;
      dVar1 = pdVar16[iVar8];
      if (((double)CONCAT44(uVar25,uVar24) <= dVar1 && dVar1 != (double)CONCAT44(uVar25,uVar24)) &&
         (pdVar16[iVar3] <= (double)CONCAT44(uVar25,uVar24))) break;
      if (((double)CONCAT44(uVar25,uVar24) < dVar1) ||
         (pdVar16[iVar3] < (double)CONCAT44(uVar25,uVar24) ||
          pdVar16[iVar3] == (double)CONCAT44(uVar25,uVar24))) {
        puVar6 = ((comp.this)->complementation).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (comp.this)->inds[iVar8];
        uVar5 = (comp.this)->inds[iVar3];
        lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                 .
                                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           + 0x30 + (long)(int)uVar5 * 0x38);
        lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar8] != '\0']._M_t.
                                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                 .
                                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                           + 0x30 + (long)(int)uVar4 * 0x38);
        if ((lVar20 < lVar15) ||
           ((lVar20 <= lVar15 &&
            (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
            lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
            (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
            ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20) <
            (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
            ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20))))) break;
      }
      _Var13._M_current = _Var13._M_current + -1;
    }
  }
  if (piVar21 < _Var13._M_current) {
    iVar8 = *_Var13._M_current;
    piVar14 = piVar21;
    piVar22 = _Var13._M_current;
LAB_002839a9:
    *piVar14 = iVar8;
    *piVar22 = iVar17;
LAB_002839af:
    do {
      _Var9._M_current = piVar14;
      piVar14 = _Var9._M_current + 1;
      iVar17 = *piVar14;
      dVar1 = pdVar16[iVar17];
      if ((double)CONCAT44(uVar25,uVar24) <= dVar1 && dVar1 != (double)CONCAT44(uVar25,uVar24)) {
        if (pdVar16[iVar3] <= (double)CONCAT44(uVar25,uVar24)) goto LAB_002839af;
      }
      if ((dVar1 <= (double)CONCAT44(uVar25,uVar24)) &&
         ((double)CONCAT44(uVar25,uVar24) <= pdVar16[iVar3] &&
          pdVar16[iVar3] != (double)CONCAT44(uVar25,uVar24))) goto LAB_00283a9f;
      puVar6 = ((comp.this)->complementation).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (comp.this)->inds[iVar17];
      uVar5 = (comp.this)->inds[iVar3];
      lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         + 0x30 + (long)(int)uVar5 * 0x38);
      lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0']._M_t.
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         + 0x30 + (long)(int)uVar4 * 0x38);
      if ((lVar15 <= lVar20) &&
         ((lVar15 < lVar20 ||
          (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
          lVar15 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
          (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
          ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20) <=
          (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar15 >> 0x20 ^
          ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20))))) goto LAB_00283a9f;
    } while( true );
  }
LAB_00283bb2:
  *begin._M_current = *_Var9._M_current;
  *_Var9._M_current = iVar3;
  uVar11 = (long)_Var9._M_current - (long)begin._M_current >> 2;
  _Var12._M_current = _Var9._M_current + 1;
  uVar23 = (long)end._M_current - (long)_Var12._M_current >> 2;
  if (((long)uVar11 < (long)(uVar19 >> 3)) || ((long)uVar23 < (long)(uVar19 >> 3))) {
    local_84 = local_84 + -1;
    if (local_84 == 0) {
      uVar11 = uVar19 - 2 >> 1;
      do {
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__2>>
                  (begin,uVar11,uVar19,begin._M_current[uVar11],
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:86:13)>
                    )comp);
        bVar7 = uVar11 != 0;
        uVar11 = uVar11 - 1;
      } while (bVar7);
      if (lVar10 < 5) {
        return;
      }
      lVar10 = (long)end._M_current - (long)begin._M_current;
      do {
        end._M_current = end._M_current + -1;
        iVar3 = *end._M_current;
        *end._M_current = *begin._M_current;
        lVar10 = lVar10 + -4;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__2>>
                  (begin,0,lVar10 >> 2,iVar3,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:86:13)>
                    )comp);
      } while (4 < lVar10);
      return;
    }
    if (0x17 < (long)uVar11) {
      uVar19 = uVar11 & 0xfffffffffffffffc;
      iVar3 = *begin._M_current;
      *begin._M_current = *(begin._M_current + uVar19);
      *(begin._M_current + uVar19) = iVar3;
      iVar3 = _Var9._M_current[-1];
      _Var9._M_current[-1] = *(_Var9._M_current - uVar19);
      *(_Var9._M_current - uVar19) = iVar3;
      if (0x80 < uVar11) {
        uVar11 = uVar11 >> 2;
        iVar3 = begin._M_current[1];
        begin._M_current[1] = begin._M_current[uVar11 + 1];
        begin._M_current[uVar11 + 1] = iVar3;
        iVar3 = begin._M_current[2];
        begin._M_current[2] = begin._M_current[uVar11 + 2];
        begin._M_current[uVar11 + 2] = iVar3;
        iVar3 = _Var9._M_current[-2];
        _Var9._M_current[-2] = _Var9._M_current[~uVar11];
        _Var9._M_current[~uVar11] = iVar3;
        iVar3 = _Var9._M_current[-3];
        _Var9._M_current[-3] = _Var9._M_current[-2 - uVar11];
        _Var9._M_current[-2 - uVar11] = iVar3;
      }
    }
    if (0x17 < (long)uVar23) {
      iVar3 = _Var9._M_current[1];
      uVar19 = uVar23 & 0xfffffffffffffffc;
      _Var9._M_current[1] = *(uVar19 + 4 + _Var9._M_current);
      *(uVar19 + 4 + _Var9._M_current) = iVar3;
      iVar3 = end._M_current[-1];
      end._M_current[-1] = *(end._M_current - uVar19);
      *(end._M_current - uVar19) = iVar3;
      if (0x80 < uVar23) {
        uVar19 = uVar23 >> 2;
        iVar3 = _Var9._M_current[2];
        _Var9._M_current[2] = _Var9._M_current[uVar19 + 2];
        _Var9._M_current[uVar19 + 2] = iVar3;
        iVar3 = _Var9._M_current[3];
        _Var9._M_current[3] = _Var9._M_current[uVar19 + 3];
        _Var9._M_current[uVar19 + 3] = iVar3;
        iVar3 = end._M_current[-2];
        end._M_current[-2] = end._M_current[~uVar19];
        end._M_current[~uVar19] = iVar3;
        iVar3 = end._M_current[-3];
        end._M_current[-3] = end._M_current[-2 - uVar19];
        end._M_current[-2 - uVar19] = iVar3;
      }
    }
  }
  else if (((_Var13._M_current <= piVar21) &&
           (bVar7 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                              (begin,_Var9,comp), bVar7)) &&
          (bVar7 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                             (_Var12,end,comp), bVar7)) {
    return;
  }
  pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
            (begin,_Var9,comp,local_84,(bool)(leftmost & 1));
  leftmost = false;
  lVar10 = (long)end._M_current - (long)_Var12._M_current;
  begin._M_current = _Var12._M_current;
  uVar19 = uVar23;
LAB_002843ce:
  if ((long)uVar19 < 0x18) goto code_r0x002843e4;
  goto LAB_00283441;
LAB_00283a9f:
  piVar22 = piVar22 + -1;
  iVar8 = *piVar22;
  dVar1 = pdVar16[iVar8];
  if (((double)CONCAT44(uVar25,uVar24) <= dVar1 && dVar1 != (double)CONCAT44(uVar25,uVar24)) &&
     (pdVar16[iVar3] <= (double)CONCAT44(uVar25,uVar24))) goto LAB_00283b92;
  if (((double)CONCAT44(uVar25,uVar24) < dVar1) ||
     (pdVar16[iVar3] < (double)CONCAT44(uVar25,uVar24) ||
      pdVar16[iVar3] == (double)CONCAT44(uVar25,uVar24))) {
    puVar6 = ((comp.this)->complementation).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (comp.this)->inds[iVar8];
    uVar5 = (comp.this)->inds[iVar3];
    lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                       + 0x30 + (long)(int)uVar5 * 0x38);
    lVar15 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar8] != '\0']._M_t.
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                       + 0x30 + (long)(int)uVar4 * 0x38);
    if ((lVar20 < lVar15) ||
       ((lVar20 <= lVar15 &&
        (lVar15 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
        lVar20 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
        (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar20 >> 0x20 ^
        ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar15) <
        (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar20 >> 0x20 ^
        ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar15))))) goto LAB_00283b92;
  }
  goto LAB_00283a9f;
LAB_00283b92:
  if (piVar22 <= piVar14) goto LAB_00283bb2;
  goto LAB_002839a9;
code_r0x002843e4:
  if ((leftmost & 1U) == 0) {
LAB_002843ef:
    if (begin._M_current == end._M_current) {
      return;
    }
    if (begin._M_current + 1 == end._M_current) {
      return;
    }
    pdVar16 = ((comp.this)->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar1 = (comp.this)->feastol;
    piVar21 = begin._M_current + 1;
LAB_00284435:
    iVar17 = *begin._M_current;
    iVar3 = begin._M_current[1];
    dVar2 = pdVar16[iVar3];
    piVar14 = piVar21;
    if ((dVar1 < dVar2) && (pdVar16[iVar17] <= dVar1)) {
LAB_002844c7:
      do {
        *piVar14 = iVar17;
        iVar17 = piVar14[-2];
        if ((dVar2 <= dVar1) || (dVar1 < pdVar16[iVar17])) {
          if ((dVar2 <= dVar1) && (dVar1 < pdVar16[iVar17])) goto LAB_002845b3;
          puVar6 = ((comp.this)->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = (comp.this)->inds[iVar3];
          uVar5 = (comp.this)->inds[iVar17];
          lVar10 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0'].
                                   _M_t.
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar5 * 0x38);
          lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t
                                   .
                                   super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                                   .
                                   super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             + 0x30 + (long)(int)uVar4 * 0x38);
          if ((lVar20 <= lVar10) &&
             ((lVar20 < lVar10 ||
              (lVar20 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
              lVar10 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
              (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
              ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar20) <=
              (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
              ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar20))))) goto LAB_002845b3;
        }
        piVar14 = piVar14 + -1;
      } while( true );
    }
    if ((dVar1 < dVar2) || (pdVar16[iVar17] <= dVar1)) {
      puVar6 = ((comp.this)->complementation).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (comp.this)->inds[iVar3];
      uVar5 = (comp.this)->inds[iVar17];
      lVar10 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar17] != '\0']._M_t.
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         + 0x30 + (long)(int)uVar5 * 0x38);
      lVar20 = *(long *)((long)(&(comp.nodequeue)->colLowerNodesPtr)[puVar6[iVar3] != '\0']._M_t.
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                         + 0x30 + (long)(int)uVar4 * 0x38);
      if ((lVar10 < lVar20) ||
         ((lVar10 <= lVar20 &&
          (lVar10 = (ulong)(uint)*comp.r + 0x8a183895eeac1536,
          lVar20 = (ulong)(uint)*comp.r + 0x80c8963be3e4c2f3,
          (((ulong)uVar5 + 0xc8497d2a400d9551) * lVar20 >> 0x20 ^
          ((ulong)uVar5 + 0x42d8680e260ae5b) * lVar10) <
          (((ulong)uVar4 + 0xc8497d2a400d9551) * lVar20 >> 0x20 ^
          ((ulong)uVar4 + 0x42d8680e260ae5b) * lVar10))))) goto LAB_002844c7;
    }
    goto LAB_002845bc;
  }
  goto LAB_00283158;
LAB_002845b3:
  piVar14[-1] = iVar3;
LAB_002845bc:
  piVar14 = piVar21 + 1;
  begin._M_current = piVar21;
  piVar21 = piVar14;
  if (piVar14 == end._M_current) {
    return;
  }
  goto LAB_00284435;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }